

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O0

int done2(void)

{
  char cVar1;
  
  cVar1 = paranoid_yn("Really quit?",iflags.paranoid_quit);
  if (cVar1 == 'n') {
    flush_screen();
    if (0 < multi) {
      nomul(0,(char *)0x0);
    }
    if (multi == 0) {
      u._1052_1_ = u._1052_1_ & 0xef;
      u.usleep = 0;
    }
  }
  else {
    killer = (char *)0x0;
    done(0xe);
  }
  return 0;
}

Assistant:

int done2(void)
{
	if (paranoid_yn("Really quit?", iflags.paranoid_quit) == 'n') {
		flush_screen();
		if (multi > 0) nomul(0, NULL);
		if (multi == 0) {
		    u.uinvulnerable = FALSE;	/* avoid ctrl-C bug -dlc */
		    u.usleep = 0;
		}
		return 0;
	}

	killer = 0;
	done(QUIT);
	return 0;
}